

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_sorting.cpp
# Opt level: O0

void sorting::rgb(vector<Palette,_std::allocator<Palette>_> *palettes)

{
  bool bVar1;
  reference this;
  iterator pvVar2;
  iterator pvVar3;
  Palette *pal;
  iterator __end1;
  iterator __begin1;
  vector<Palette,_std::allocator<Palette>_> *__range1;
  vector<Palette,_std::allocator<Palette>_> *palettes_local;
  
  Options::verbosePrint(&options,'\x02',"Sorting palettes by \"\"\"luminance\"\"\"...\n");
  __end1 = std::vector<Palette,_std::allocator<Palette>_>::begin(palettes);
  pal = (Palette *)std::vector<Palette,_std::allocator<Palette>_>::end(palettes);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                      (&__end1,(__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                                *)&pal);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this = __gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
           ::operator*(&__end1);
    pvVar2 = Palette::begin(this);
    pvVar3 = Palette::end(this);
    std::sort<unsigned_short*,sorting::rgb(std::vector<Palette,std::allocator<Palette>>&)::__0>
              (pvVar2,pvVar3);
    __gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void rgb(std::vector<Palette> &palettes) {
	options.verbosePrint(Options::VERB_LOG_ACT, "Sorting palettes by \"\"\"luminance\"\"\"...\n");

	for (Palette &pal : palettes) {
		std::sort(pal.begin(), pal.end(), [](uint16_t lhs, uint16_t rhs) {
			return legacyLuminance(lhs) > legacyLuminance(rhs);
		});
	}
}